

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O3

bool axl::io::ensureDirExists(StringRef *fileName0)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  String fileName;
  StringRef local_48;
  
  bVar3 = true;
  if ((fileName0->m_length != 0) && (bVar2 = isDir(fileName0), !bVar2)) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_48,fileName0);
    bVar3 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::ensureExclusive
                      ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_48);
    pcVar6 = local_48.m_p;
    if (!bVar3) {
      pcVar6 = (char *)0x0;
    }
    pcVar6 = pcVar6 + -1;
    do {
      pcVar5 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
    } while (*pcVar5 == '/');
    if (*pcVar5 == '\0') {
      bVar3 = true;
    }
    else {
LAB_00137264:
      do {
        cVar1 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
        if (cVar1 != '\0') {
          if (cVar1 != '/') goto LAB_00137264;
        }
        *pcVar6 = '\0';
        bVar3 = isDir(&local_48);
        if (!bVar3) {
          pcVar5 = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
          if (local_48.m_length != 0) {
            pcVar5 = local_48.m_p;
          }
          iVar4 = mkdir(pcVar5,0x1c0);
          if (iVar4 != 0) {
            err::setLastSystemError();
            bVar3 = false;
            break;
          }
        }
        bVar3 = true;
        if (cVar1 == '\0') break;
        *pcVar6 = cVar1;
        do {
          pcVar5 = pcVar6 + 1;
          pcVar6 = pcVar6 + 1;
        } while (*pcVar5 == '/');
      } while (*pcVar5 != '\0');
    }
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_48);
  }
  return bVar3;
}

Assistant:

bool
ensureDirExists(const sl::StringRef& fileName0) {
	if (fileName0.isEmpty() || isDir(fileName0))
		return true;

	sl::String fileName = fileName0;

	char* p = fileName.getBuffer(); // ensure exclusive buffer (we're going to modify it)
	while (*p == '/') // skip root
		p++;

	while (*p) {
		char* p2 = p + 1;
		while (*p2 && *p2 != '/')
			p2++;

		char c = *p2; // save
		*p2 = 0;

		if (!isDir(fileName)) {
			int result = ::mkdir(fileName, S_IRWXU);
			if (result != 0)
				return err::failWithLastSystemError();
		}

		if (!c)
			break;

		*p2 = c; // restore

		p = p2 + 1;
		while (*p == '/') // skip separators
			p++;
	}

	return true;
}